

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_clip_samples_s16(ma_int16 *pDst,ma_int32 *pSrc,ma_uint64 count)

{
  ma_uint64 mVar1;
  ma_int16 mVar2;
  int iVar3;
  
  if (count != 0) {
    mVar1 = 0;
    do {
      iVar3 = pSrc[mVar1];
      if (0x7ffe < iVar3) {
        iVar3 = 0x7fff;
      }
      mVar2 = (ma_int16)iVar3;
      if (iVar3 < -0x7fff) {
        mVar2 = -0x8000;
      }
      pDst[mVar1] = mVar2;
      mVar1 = mVar1 + 1;
    } while (count != mVar1);
  }
  return;
}

Assistant:

MA_API void ma_clip_samples_s16(ma_int16* pDst, const ma_int32* pSrc, ma_uint64 count)
{
    ma_uint64 iSample;

    MA_ASSERT(pDst != NULL);
    MA_ASSERT(pSrc != NULL);

    for (iSample = 0; iSample < count; iSample += 1) {
        pDst[iSample] = ma_clip_s16(pSrc[iSample]);
    }
}